

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O3

double rapidjson::internal::StrtodFullPrecision
                 (double d,int p,char *decimals,size_t length,size_t decimalPosition,int exp)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  double result;
  double local_d38;
  BigInteger local_d30;
  
  uVar5 = (ulong)(uint)p;
  if (d < 0.0) {
    __assert_fail("d >= 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/strtod.h"
                  ,0xe1,
                  "double rapidjson::internal::StrtodFullPrecision(double, int, const char *, size_t, size_t, int)"
                 );
  }
  if (length == 0) {
    __assert_fail("length >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/strtod.h"
                  ,0xe2,
                  "double rapidjson::internal::StrtodFullPrecision(double, int, const char *, size_t, size_t, int)"
                 );
  }
  if (p - 0x17U < 0xf) {
    d = d * *(double *)(Pow10(int)::e + (ulong)(p - 0x16) * 8);
    uVar5 = 0x16;
    if (d <= 9007199254740991.0) {
LAB_0047c8d2:
      return d * *(double *)(Pow10(int)::e + uVar5 * 8);
    }
  }
  else if (d <= 9007199254740991.0 && p + 0x16U < 0x2d) {
    if (p < 0) {
      return d / *(double *)(Pow10(int)::e + (ulong)(uint)-p * 8);
    }
    goto LAB_0047c8d2;
  }
  if (length != 1 && *decimals == '0') {
    do {
      length = length - 1;
      decimalPosition = decimalPosition - 1;
      pcVar1 = decimals + 1;
      decimals = decimals + 1;
      if (*pcVar1 != '0') break;
    } while (1 < length);
  }
  if (1 < length) {
    cVar2 = decimals[length - 1];
    uVar5 = length;
    while (length = uVar5, cVar2 == '0') {
      length = uVar5 - 1;
      decimalPosition = decimalPosition - 1;
      exp = exp + 1;
      if (length < 2) break;
      cVar2 = decimals[uVar5 - 2];
      uVar5 = length;
    }
  }
  uVar5 = 0;
  if (0x30c < (int)length) {
    uVar5 = (ulong)((int)length - 0x30c);
    length = 0x30c;
  }
  iVar4 = exp + (int)uVar5;
  dVar6 = 0.0;
  if (-0x145 < iVar4 + (int)length) {
    bVar3 = StrtodDiyFp(decimals,length,decimalPosition - uVar5,iVar4,&local_d38);
    dVar6 = local_d38;
    if (!bVar3) {
      BigInteger::BigInteger(&local_d30,decimals,length);
      iVar4 = CheckWithinHalfULP(local_d38,&local_d30,
                                 (iVar4 - (int)length) + (int)(decimalPosition - uVar5));
      if ((-1 < iVar4) && ((iVar4 != 0 || (((ulong)local_d38 & 1) != 0)))) {
        if ((long)local_d38 < 0) {
          __assert_fail("!Sign()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/ieee754.h"
                        ,0x21,"double rapidjson::internal::Double::NextPositiveDouble() const");
        }
        dVar6 = (double)((long)local_d38 + 1);
      }
    }
  }
  return dVar6;
}

Assistant:

inline double StrtodFullPrecision(double d, int p, const char* decimals, size_t length, size_t decimalPosition, int exp) {
    RAPIDJSON_ASSERT(d >= 0.0);
    RAPIDJSON_ASSERT(length >= 1);

    double result;
    if (StrtodFast(d, p, &result))
        return result;

    // Trim leading zeros
    while (*decimals == '0' && length > 1) {
        length--;
        decimals++;
        decimalPosition--;
    }

    // Trim trailing zeros
    while (decimals[length - 1] == '0' && length > 1) {
        length--;
        decimalPosition--;
        exp++;
    }

    // Trim right-most digits
    const int kMaxDecimalDigit = 780;
    if (static_cast<int>(length) > kMaxDecimalDigit) {
        int delta = (static_cast<int>(length) - kMaxDecimalDigit);
        exp += delta;
        decimalPosition -= static_cast<unsigned>(delta);
        length = kMaxDecimalDigit;
    }

    // If too small, underflow to zero
    if (int(length) + exp < -324)
        return 0.0;

    if (StrtodDiyFp(decimals, length, decimalPosition, exp, &result))
        return result;

    // Use approximation from StrtodDiyFp and make adjustment with BigInteger comparison
    return StrtodBigInteger(result, decimals, length, decimalPosition, exp);
}